

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

void __thiscall dtc::fdt::device_tree::write<dtc::dtb::asm_writer>(device_tree *this,int fd)

{
  pointer ppVar1;
  _func_int **pp_Var2;
  int fd_00;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  pair<unsigned_long,_unsigned_long> *i;
  pointer ppVar6;
  uint uVar7;
  char *__end;
  asm_writer struct_writer;
  asm_writer strings_writer;
  asm_writer reservation_writer;
  header head;
  asm_writer head_writer;
  string_table st;
  string local_178;
  _func_int **local_158;
  int local_14c;
  asm_writer local_148;
  asm_writer local_120;
  asm_writer local_f8;
  header local_d0;
  asm_writer local_a8;
  string_table local_80;
  
  local_80.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header;
  __n = 0;
  local_80.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80.string_offsets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80.strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.size = 0;
  local_d0.magic = 0xd00dfeed;
  local_d0.version = 0x11;
  local_d0.last_comp_version = 0x10;
  local_d0.boot_cpuid_phys = 0;
  local_158 = (_func_int **)&PTR_write_label_00148108;
  local_a8.super_output_writer._vptr_output_writer = (_func_int **)&PTR_write_label_00148108;
  local_a8.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.byte_count = 0;
  local_a8.bytes_written = 0;
  local_f8.super_output_writer._vptr_output_writer = (_func_int **)&PTR_write_label_00148108;
  local_f8.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.byte_count = 0;
  local_f8.bytes_written = 0;
  local_148.super_output_writer._vptr_output_writer = (_func_int **)&PTR_write_label_00148108;
  local_148.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.byte_count = 0;
  local_148.bytes_written = 0;
  local_120.super_output_writer._vptr_output_writer = (_func_int **)&PTR_write_label_00148108;
  local_120.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.byte_count = 0;
  local_120.bytes_written = 0;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_80.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Memory reservations","");
  dtb::asm_writer::write_comment(&local_f8,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"dt_reserve_map","");
  dtb::asm_writer::write_label(&local_f8,&local_178);
  local_14c = fd;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  ppVar6 = (this->reservations).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->reservations).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar1) {
    do {
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Reservation start","");
      dtb::asm_writer::write_comment(&local_f8,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      dtb::asm_writer::write_data(&local_f8,ppVar6->first);
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Reservation length","");
      dtb::asm_writer::write_comment(&local_f8,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      dtb::asm_writer::write_data(&local_f8,ppVar6->second);
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar1);
  }
  uVar7 = 0;
  do {
    dtb::asm_writer::write_data(&local_f8,0);
    dtb::asm_writer::write_data(&local_f8,0);
    pp_Var2 = local_158;
    uVar7 = uVar7 + 1;
  } while (uVar7 <= this->spare_reserve_map_entries);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Device tree","");
  fd_00 = local_14c;
  dtb::asm_writer::write_comment(&local_148,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"dt_struct_start","");
  dtb::asm_writer::write_label(&local_148,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  node::write((this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              (int)&local_148,&local_80,__n);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"FDT_END","");
  (*local_148.super_output_writer._vptr_output_writer[1])(&local_148,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  (*local_148.super_output_writer._vptr_output_writer[4])(&local_148,9);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"dt_struct_end","");
  dtb::asm_writer::write_label(&local_148,&local_178);
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_00;
  }
  dtb::string_table::write(&local_80,(int)&local_120,__buf,__n);
  local_d0.size_dt_strings = dtb::asm_writer::size(&local_120);
  if (this->blob_padding != 0) {
    uVar7 = 0;
    do {
      dtb::asm_writer::write_data(&local_120,'\0');
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->blob_padding);
  }
  uVar3 = dtb::asm_writer::size(&local_120);
  uVar4 = dtb::asm_writer::size(&local_148);
  uVar5 = dtb::asm_writer::size(&local_f8);
  local_d0.totalsize = uVar5 + uVar3 + uVar4 + 0x28;
  while (local_d0.totalsize < this->minimum_blob_size) {
    local_d0.totalsize = local_d0.totalsize + 1;
    dtb::asm_writer::write_data(&local_120,'\0');
  }
  uVar3 = dtb::asm_writer::size(&local_f8);
  local_d0.off_dt_struct = uVar3 + 0x28;
  local_d0.off_dt_strings = dtb::asm_writer::size(&local_148);
  local_d0.off_dt_strings = local_d0.off_dt_strings + uVar3 + 0x28;
  local_d0.off_mem_rsvmap = 0x28;
  local_d0.boot_cpuid_phys = this->boot_cpu;
  local_d0.size_dt_struct = dtb::asm_writer::size(&local_148);
  dtb::header::write(&local_d0,(int)&local_a8,__buf_00,__n);
  dtb::asm_writer::write_to_file(&local_a8,fd_00);
  dtb::asm_writer::write_to_file(&local_f8,fd_00);
  dtb::asm_writer::write_to_file(&local_148,fd_00);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"dt_blob_end","");
  dtb::asm_writer::write_label(&local_120,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  dtb::asm_writer::write_to_file(&local_120,fd_00);
  local_120.super_output_writer._vptr_output_writer = pp_Var2;
  if (local_120.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_148.super_output_writer._vptr_output_writer = pp_Var2;
  if (local_148.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.super_output_writer._vptr_output_writer = pp_Var2;
  if (local_f8.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_a8.super_output_writer._vptr_output_writer = pp_Var2;
  if (local_a8.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80.strings);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&local_80);
  return;
}

Assistant:

void
device_tree::write(int fd)
{
	dtb::string_table st;
	dtb::header head;
	writer head_writer;
	writer reservation_writer;
	writer struct_writer;
	writer strings_writer;

	// Build the reservation table
	reservation_writer.write_comment(string("Memory reservations"));
	reservation_writer.write_label(string("dt_reserve_map"));
	for (auto &i : reservations)
	{
		reservation_writer.write_comment(string("Reservation start"));
		reservation_writer.write_data(i.first);
		reservation_writer.write_comment(string("Reservation length"));
		reservation_writer.write_data(i.second);
	}
	// Write n spare reserve map entries, plus the trailing 0.
	for (uint32_t i=0 ; i<=spare_reserve_map_entries ; i++)
	{
		reservation_writer.write_data((uint64_t)0);
		reservation_writer.write_data((uint64_t)0);
	}


	struct_writer.write_comment(string("Device tree"));
	struct_writer.write_label(string("dt_struct_start"));
	root->write(struct_writer, st);
	struct_writer.write_token(dtb::FDT_END);
	struct_writer.write_label(string("dt_struct_end"));

	st.write(strings_writer);
	// Find the strings size before we stick padding on the end.
	// Note: We should possibly use a new writer for the padding.
	head.size_dt_strings = strings_writer.size();

	// Stick the padding in the strings writer, but after the
	// marker indicating that it's the end.
	// Note: We probably should add a padding call to the writer so
	// that the asm back end can write padding directives instead
	// of a load of 0 bytes.
	for (uint32_t i=0 ; i<blob_padding ; i++)
	{
		strings_writer.write_data((uint8_t)0);
	}
	head.totalsize = sizeof(head) + strings_writer.size() +
		struct_writer.size() + reservation_writer.size();
	while (head.totalsize < minimum_blob_size)
	{
		head.totalsize++;
		strings_writer.write_data((uint8_t)0);
	}
	head.off_dt_struct = sizeof(head) + reservation_writer.size();;
	head.off_dt_strings = head.off_dt_struct + struct_writer.size();
	head.off_mem_rsvmap = sizeof(head);
	head.boot_cpuid_phys = boot_cpu;
	head.size_dt_struct = struct_writer.size();
	head.write(head_writer);

	head_writer.write_to_file(fd);
	reservation_writer.write_to_file(fd);
	struct_writer.write_to_file(fd);
	strings_writer.write_label(string("dt_blob_end"));
	strings_writer.write_to_file(fd);
}